

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

bool __thiscall FScanner::GetNumber(FScanner *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *local_20;
  char *stopper;
  FScanner *this_local;
  
  stopper = (char *)this;
  CheckOpen(this);
  bVar1 = GetString(this);
  if (bVar1) {
    iVar2 = strcmp(this->String,"MAXINT");
    if (iVar2 == 0) {
      this->Number = 0x7fffffff;
    }
    else {
      lVar3 = strtol(this->String,&local_20,0);
      this->Number = (int)lVar3;
      if (*local_20 != '\0') {
        ScriptError(this,"SC_GetNumber: Bad numeric constant \"%s\".",this->String);
      }
    }
    this->Float = (double)this->Number;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FScanner::GetNumber ()
{
	char *stopper;

	CheckOpen();
	if (GetString())
	{
		if (strcmp (String, "MAXINT") == 0)
		{
			Number = INT_MAX;
		}
		else
		{
			Number = strtol (String, &stopper, 0);
			if (*stopper != 0)
			{
				ScriptError ("SC_GetNumber: Bad numeric constant \"%s\".", String);
			}
		}
		Float = Number;
		return true;
	}
	else
	{
		return false;
	}
}